

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_delayed_mpr_recalculation(nhdp_domain *domain,nhdp_neighbor *neigh)

{
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_neighbor *neigh_local;
  nhdp_domain *domain_local;
  
  if (domain == (nhdp_domain *)0x0) {
    neigh_local = (nhdp_neighbor *)(_domain_list.next + -0x2a);
    while( true ) {
      if (neigh_local[1]._domaindata[3].best_out_link == (nhdp_link *)_domain_list.prev) break;
      nhdp_domain_delayed_mpr_recalculation((nhdp_domain *)neigh_local,neigh);
      neigh_local = (nhdp_neighbor *)((long)neigh_local[1]._domaindata[3].metric + -0x2a0);
    }
    nhdp_domain_delayed_mpr_recalculation(&_flooding_domain,neigh);
  }
  else {
    domain->_mpr_outdated = true;
  }
  return;
}

Assistant:

void
nhdp_domain_delayed_mpr_recalculation(struct nhdp_domain *domain, struct nhdp_neighbor *neigh __attribute__((unused))) {
  if (!domain) {
    list_for_each_element(&_domain_list, domain, _node) {
      nhdp_domain_delayed_mpr_recalculation(domain, neigh);
    }
    nhdp_domain_delayed_mpr_recalculation(&_flooding_domain, neigh);
    return;
  }

  domain->_mpr_outdated = true;
}